

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall Channel::~Channel(Channel *this)

{
  Channel *this_local;
  
  std::function<void_()>::~function(&this->closeCallback_);
  std::function<void_()>::~function(&this->errorCallback_);
  std::function<void_()>::~function(&this->writeCallback_);
  std::function<void_()>::~function(&this->readCallback_);
  std::enable_shared_from_this<Channel>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Channel>);
  return;
}

Assistant:

Channel::~Channel() {}